

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

int get_status(igsc_device_handle *handle)

{
  FILE *__stream;
  uint uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  uint8_t result;
  uint8_t tiles_num;
  uint32_t ifr_applied;
  uint32_t supported_tests;
  byte local_42;
  byte local_41;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  local_40 = 0;
  local_41 = 0;
  local_42 = 0;
  iVar4 = 3;
  do {
    uVar1 = igsc_ifr_get_status(handle,&local_42,&local_3c,&local_40,&local_41);
    if (uVar1 != 0xd) break;
    usleep(2000000);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (local_42 == 0 && uVar1 == 0) {
    iVar4 = 0;
    printf("Number of tiles: %u\n",(ulong)local_41);
    printf("Supported tests: scan_test: %u, array test: %u\n",(ulong)(local_3c & 1),
           (ulong)(local_3c >> 1 & 1));
    printf("Applied repairs: DSS EN repair: %u, Array repair: %u\n",(ulong)(local_40 & 1),
           (ulong)(local_40 >> 1 & 1));
  }
  else {
    if (quiet == '\0') {
      fprintf(_stderr,"Error: Failed to get ifr status, library return code %d, command result %u\n"
              ,(ulong)uVar1,(ulong)local_42);
    }
    __stream = _stdout;
    iVar4 = 1;
    if (quiet == '\0') {
      uVar2 = igsc_get_last_firmware_status(handle);
      uVar3 = igsc_translate_firmware_status(uVar2);
      uVar1 = igsc_get_last_firmware_status(handle);
      fprintf(__stream,"Firmware status: %s (0x%x)\n",uVar3,(ulong)uVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

mockable_static
int get_status(struct igsc_device_handle *handle)
{
    int      ret;
    uint32_t supported_tests = 0;
    uint32_t ifr_applied = 0;
    uint8_t  tiles_num = 0;
    uint8_t  result = 0;
    unsigned int retries = 0;

    /* call the igsc library routine to get the ifr status */
    while ((ret = igsc_ifr_get_status(handle, &result, &supported_tests, &ifr_applied, &tiles_num)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret || result)
    {
        fwupd_error("Failed to get ifr status, library return code %d, command result %u\n",
                    ret, result);
        print_device_fw_status(handle);
        return EXIT_FAILURE;
    }

    printf("Number of tiles: %u\n", tiles_num);
    printf("Supported tests: scan_test: %u, array test: %u\n",
           !!(supported_tests & IGSC_IFR_SUPPORTED_TEST_SCAN),
           !!(supported_tests & IGSC_IFR_SUPPORTED_TEST_ARRAY));
    printf("Applied repairs: DSS EN repair: %u, Array repair: %u\n",
           !!(ifr_applied & IGSC_IFR_REPAIR_DSS_EN),
           !!(ifr_applied &IGSC_IFR_REPAIR_ARRAY));

    return ret;
}